

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O2

QString * QSysInfo::kernelType(void)

{
  long lVar1;
  int iVar2;
  QString *this;
  storage_type *in_RCX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QArrayDataPointer<char16_t> local_1c0;
  utsname u;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset((utsname *)&u,0xaa,0x186);
  iVar2 = uname((utsname *)&u);
  if (iVar2 == 0) {
    this = (QString *)QByteArrayView::lengthHelperCharArray(u.sysname,0x41);
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)&u;
    QString::fromLatin1((QString *)&local_1c0,this,ba);
    QString::toLower_helper(in_RDI,(QString *)&local_1c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c0);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00205c51;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00205c51:
      __stack_chk_fail();
    }
    unknownText();
  }
  return in_RDI;
}

Assistant:

QString QSysInfo::kernelType()
{
#if defined(Q_OS_WIN)
    return QStringLiteral("winnt");
#elif defined(Q_OS_UNIX)
    struct utsname u;
    if (uname(&u) == 0)
        return QString::fromLatin1(u.sysname).toLower();
#endif
    return unknownText();
}